

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  ManagedType MVar4;
  mapped_type *pmVar5;
  cmLinkInterface *pcVar6;
  char *__s;
  char *pcVar7;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dummy;
  string prop;
  string local_218;
  key_type local_1f8;
  ImportPropertyMap *local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  key_type local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = target->Makefile;
  local_1d8 = properties;
  local_1d0 = missingTargets;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (((TVar3 == SHARED_LIBRARY) ||
      (TVar3 = cmGeneratorTarget::GetType(target), TVar3 == MODULE_LIBRARY)) &&
     (bVar2 = cmGeneratorTarget::IsDLLPlatform(target), !bVar2)) {
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    bVar2 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar2) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
      bVar2 = cmMakefile::IsOn(this_00,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        (*this->_vptr_cmExportFileGenerator[0x12])(&local_218,this,target,config);
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_1a8,0,(char *)local_1a8[0]._M_string_length,0x56629d);
      cmGeneratorTarget::GetSOName(&local_218,target,config);
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)local_1a8,0,(char *)local_1a8[0]._M_string_length,0x5662ad);
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f8,0,(char *)local_1f8._M_string_length,0x53f07c);
    }
    std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(suffix->_M_dataplus)._M_p);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_1d8,local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar6 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (pcVar6 != (cmLinkInterface *)0x0) {
    paVar1 = &local_1a8[0].field_2;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"IMPORTED_LINK_INTERFACE_LANGUAGES","");
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,local_1a8,&pcVar6->Languages,local_1d8,local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"IMPORTED_LINK_DEPENDENT_LIBRARIES","");
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,local_1a8,&pcVar6->SharedDeps,local_1d8,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                               local_1a8[0].field_2._M_local_buf[0]) + 1);
    }
    if (pcVar6->Multiplicity != 0) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"IMPORTED_LINK_INTERFACE_MULTIPLICITY","");
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)(suffix->_M_dataplus)._M_p);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_1d8,&local_1f8);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                                 local_1f8.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
  }
  MVar4 = cmGeneratorTarget::GetManagedType(target,config);
  if (MVar4 == Native) {
    return;
  }
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"IMPORTED_COMMON_LANGUAGE_RUNTIME","");
  std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(suffix->_M_dataplus)._M_p);
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"COMMON_LANGUAGE_RUNTIME","")
  ;
  __s = cmGeneratorTarget::GetProperty(target,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (char *)local_1f8._M_string_length;
  if (__s == (char *)0x0) {
    bVar2 = cmGeneratorTarget::IsCSharpOnly(target);
    if (!bVar2) goto LAB_003025ce;
    __s = "CSharp";
    pcVar7 = (char *)local_1f8._M_string_length;
  }
  else {
    strlen(__s);
  }
  std::__cxx11::string::_M_replace((ulong)&local_1f8,0,pcVar7,(ulong)__s);
LAB_003025ce:
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_1d8,local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LANGUAGES",
                                iface->Languages, properties, missingTargets);

    std::vector<std::string> dummy;
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_DEPENDENT_LIBRARIES",
                                iface->SharedDeps, properties, dummy);
    if (iface->Multiplicity > 0) {
      std::string prop = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
      prop += suffix;
      std::ostringstream m;
      m << iface->Multiplicity;
      properties[prop] = m.str();
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    prop += suffix;
    std::string propval;
    if (auto* p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}